

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_tests.cpp
# Opt level: O2

void __thiscall system_tests::run_command::test_method(run_command *this)

{
  UniValue *pUVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  string *psVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string file;
  const_string file_00;
  string_view key;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  string_view key_00;
  const_string file_12;
  const_string file_13;
  check_type cVar5;
  string *__a;
  char *local_650;
  char *local_648;
  undefined1 *local_640;
  undefined1 *local_638;
  char *local_630;
  char *local_628;
  char *local_620;
  char *local_618;
  undefined1 *local_610;
  undefined1 *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  undefined1 *local_5e0;
  undefined1 *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_590;
  char *local_588;
  undefined1 *local_580;
  undefined1 *local_578;
  char *local_570;
  char *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  UniValue local_270;
  UniValue local_218;
  string expected_1;
  UniValue local_1a0;
  string command;
  UniValue local_128;
  UniValue result;
  string local_78;
  undefined1 local_58 [16];
  undefined1 auStack_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,"",(allocator<char> *)&command);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"",(allocator<char> *)&expected_1);
  RunCommandParseJSON(&result,(string *)local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)local_58);
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x19;
  file.m_begin = (iterator)&local_2f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_308,msg);
  local_78._M_dataplus._M_p._0_1_ = result.typ == VNULL;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  command._M_dataplus._M_p = "result.isNull()";
  command._M_string_length = (long)"result.isNull()" + 0xf;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_0113a070;
  auStack_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_310 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  auStack_48._8_8_ = &command;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_58,1,0,WARN,_cVar5,
             (size_t)&local_318,0x19);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  UniValue::~UniValue(&result);
  __a = &command;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,"echo {\"success\": true}",(allocator<char> *)__a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"",(allocator<char> *)&expected_1);
  RunCommandParseJSON(&result,(string *)local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)local_58);
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  file_00.m_end = (iterator)0x1d;
  file_00.m_begin = (iterator)&local_328;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_338,
             msg_00);
  local_78._M_dataplus._M_p._0_1_ = result.typ == VOBJ;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  command._M_dataplus._M_p = "result.isObject()";
  command._M_string_length = (long)"result.isObject()" + 0x11;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_0113a070;
  auStack_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_340 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  auStack_48._8_8_ = __a;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_58,1,0,WARN,_cVar5,
             (size_t)&local_348,0x1d);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  key._M_str = "success";
  key._M_len = 7;
  pUVar1 = UniValue::find_value(&result,key);
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  file_01.m_end = (iterator)0x1f;
  file_01.m_begin = (iterator)&local_358;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_368,
             msg_01);
  local_78._M_dataplus._M_p._0_1_ = pUVar1->typ != VNULL;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  command._M_dataplus._M_p = "!success.isNull()";
  command._M_string_length = (long)"!success.isNull()" + 0x11;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_0113a070;
  auStack_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_370 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  auStack_48._8_8_ = __a;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_58,1,0,WARN,_cVar5,
             (size_t)&local_378,0x1f);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  file_02.m_end = (iterator)0x20;
  file_02.m_begin = (iterator)&local_388;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_398,
             msg_02);
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  auStack_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  auStack_48._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_3a0 = "";
  local_78._M_dataplus._M_p._0_1_ = UniValue::get_bool(pUVar1);
  psVar4 = &local_78;
  command._M_dataplus._M_p._0_1_ = 1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_58,&local_3a8,0x20,1,2,psVar4,"success.get_bool()",__a,"true");
  UniValue::~UniValue(&result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"execve failed: ",(allocator<char> *)local_58);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)psVar4;
  msg_03.m_begin = pvVar2;
  file_03.m_end = (iterator)0x25;
  file_03.m_begin = (iterator)&local_3b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3c8,
             msg_03);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,"invalid_command",(allocator<char> *)&command);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"",(allocator<char> *)&expected_1);
  RunCommandParseJSON(&local_128,(string *)local_58,&local_78);
  UniValue::~UniValue(&local_128);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)local_58);
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)psVar4;
  msg_04.m_begin = pvVar2;
  file_04.m_end = (iterator)0x25;
  file_04.m_begin = (iterator)&local_3d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3e8,
             msg_04);
  local_78._M_dataplus._M_p._0_1_ = 0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_0113d390;
  auStack_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  auStack_48._8_8_ = "exception subprocess::CalledProcessError expected but not raised";
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_3f0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_58,1,1,WARN,(check_type)__a,
             (size_t)&local_3f8,0x25);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&command,"false",(allocator<char> *)&result);
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar3;
  msg_05.m_begin = pvVar2;
  file_05.m_end = (iterator)0x2e;
  file_05.m_begin = (iterator)&local_438;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_448,
             msg_05);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"",(allocator<char> *)local_58);
  RunCommandParseJSON(&local_1a0,&command,(string *)&result);
  UniValue::~UniValue(&local_1a0);
  std::__cxx11::string::~string((string *)&result);
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar3;
  msg_06.m_begin = pvVar2;
  file_06.m_end = (iterator)0x2e;
  file_06.m_begin = (iterator)&local_458;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_468,
             msg_06);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  auStack_48._0_8_ = 0;
  result.val._M_dataplus._M_p._0_1_ = 0;
  result._0_8_ = &PTR__lazy_ostream_0113a848;
  result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  result.val.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_1bf509;
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_470 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)&result,1,1,WARN,(check_type)__a,
             (size_t)&local_478,0x2e);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_48);
  std::__cxx11::string::~string((string *)&command);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&command,"sh -c \'echo err 1>&2 && false\'",(allocator<char> *)&result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expected_1,"err",(allocator<char> *)&result);
  local_4b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_4b0 = "";
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar3;
  msg_07.m_begin = pvVar2;
  file_07.m_end = (iterator)0x39;
  file_07.m_begin = (iterator)&local_4b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_4c8,
             msg_07);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"",(allocator<char> *)local_58);
  RunCommandParseJSON(&local_218,&command,(string *)&result);
  UniValue::~UniValue(&local_218);
  std::__cxx11::string::~string((string *)&result);
  local_4d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar3;
  msg_08.m_begin = pvVar2;
  file_08.m_end = (iterator)0x39;
  file_08.m_begin = (iterator)&local_4d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_4e8,
             msg_08);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  auStack_48._0_8_ = 0;
  result.val._M_dataplus._M_p._0_1_ = 0;
  result._0_8_ = &PTR__lazy_ostream_0113a848;
  result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  result.val.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_1bf509;
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_4f0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)&result,1,1,WARN,(check_type)__a,
             (size_t)&local_4f8,0x39);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_48);
  std::__cxx11::string::~string((string *)&expected_1);
  std::__cxx11::string::~string((string *)&command);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"echo {",(allocator<char> *)local_58);
  local_550 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_548 = "";
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar3;
  msg_09.m_begin = pvVar2;
  file_09.m_end = (iterator)0x3e;
  file_09.m_begin = (iterator)&local_550;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_560,
             msg_09);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,"",(allocator<char> *)&local_78);
  RunCommandParseJSON(&local_270,(string *)&result,(string *)local_58);
  UniValue::~UniValue(&local_270);
  std::__cxx11::string::~string((string *)local_58);
  local_570 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_568 = "";
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar3;
  msg_10.m_begin = pvVar2;
  file_10.m_end = (iterator)0x3e;
  file_10.m_begin = (iterator)&local_570;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_580,
             msg_10);
  local_78._M_dataplus._M_p._0_1_ = 0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_0113a848;
  auStack_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  auStack_48._8_8_ = "exception std::runtime_error expected but not raised";
  local_590 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_588 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_58,1,1,WARN,(check_type)__a,
             (size_t)&local_590,0x3e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,"cat",(allocator<char> *)&command);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"{\"success\": true}",(allocator<char> *)&expected_1);
  RunCommandParseJSON(&result,(string *)local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)local_58);
  local_5d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_5c8 = "";
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pvVar3;
  msg_11.m_begin = pvVar2;
  file_11.m_end = (iterator)0x43;
  file_11.m_begin = (iterator)&local_5d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_5e0,
             msg_11);
  local_78._M_dataplus._M_p._0_1_ = result.typ == VOBJ;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  command._M_dataplus._M_p = "result.isObject()";
  command._M_string_length = (long)"result.isObject()" + 0x11;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_0113a070;
  auStack_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_5f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_5e8 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  auStack_48._8_8_ = &command;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_58,1,0,WARN,(check_type)__a,
             (size_t)&local_5f0,0x43);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  key_00._M_str = "success";
  key_00._M_len = 7;
  pUVar1 = UniValue::find_value(&result,key_00);
  local_600 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_5f8 = "";
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = pvVar3;
  msg_12.m_begin = pvVar2;
  file_12.m_end = (iterator)0x45;
  file_12.m_begin = (iterator)&local_600;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_610,
             msg_12);
  local_78._M_dataplus._M_p._0_1_ = pUVar1->typ != VNULL;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  command._M_dataplus._M_p = "!success.isNull()";
  command._M_string_length = (long)"!success.isNull()" + 0x11;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_0113a070;
  auStack_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_620 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_618 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  auStack_48._8_8_ = &command;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_58,1,0,WARN,(check_type)__a,
             (size_t)&local_620,0x45);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_630 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_628 = "";
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = pvVar3;
  msg_13.m_begin = pvVar2;
  file_13.m_end = (iterator)0x46;
  file_13.m_begin = (iterator)&local_630;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_640,
             msg_13);
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_01139f30;
  auStack_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  auStack_48._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_650 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_648 = "";
  local_78._M_dataplus._M_p._0_1_ = UniValue::get_bool(pUVar1);
  command._M_dataplus._M_p._0_1_ = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_58,&local_650,0x46,1,2,&local_78,"success.get_bool()",&command,"true");
  UniValue::~UniValue(&result);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(run_command)
{
    {
        const UniValue result = RunCommandParseJSON("");
        BOOST_CHECK(result.isNull());
    }
    {
        const UniValue result = RunCommandParseJSON("echo {\"success\": true}");
        BOOST_CHECK(result.isObject());
        const UniValue& success = result.find_value("success");
        BOOST_CHECK(!success.isNull());
        BOOST_CHECK_EQUAL(success.get_bool(), true);
    }
    {
        // An invalid command is handled by cpp-subprocess
        const std::string expected{"execve failed: "};
        BOOST_CHECK_EXCEPTION(RunCommandParseJSON("invalid_command"), subprocess::CalledProcessError, HasReason(expected));
    }
    {
        // Return non-zero exit code, no output to stderr
        const std::string command{"false"};
        BOOST_CHECK_EXCEPTION(RunCommandParseJSON(command), std::runtime_error, [&](const std::runtime_error& e) {
            const std::string what{e.what()};
            BOOST_CHECK(what.find(strprintf("RunCommandParseJSON error: process(%s) returned 1: \n", command)) != std::string::npos);
            return true;
        });
    }
    {
        // Return non-zero exit code, with error message for stderr
        const std::string command{"sh -c 'echo err 1>&2 && false'"};
        const std::string expected{"err"};
        BOOST_CHECK_EXCEPTION(RunCommandParseJSON(command), std::runtime_error, [&](const std::runtime_error& e) {
            const std::string what(e.what());
            BOOST_CHECK(what.find(strprintf("RunCommandParseJSON error: process(%s) returned", command)) != std::string::npos);
            BOOST_CHECK(what.find(expected) != std::string::npos);
            return true;
        });
    }
    {
        // Unable to parse JSON
        const std::string command{"echo {"};
        BOOST_CHECK_EXCEPTION(RunCommandParseJSON(command), std::runtime_error, HasReason("Unable to parse JSON: {"));
    }
    // Test std::in
    {
        const UniValue result = RunCommandParseJSON("cat", "{\"success\": true}");
        BOOST_CHECK(result.isObject());
        const UniValue& success = result.find_value("success");
        BOOST_CHECK(!success.isNull());
        BOOST_CHECK_EQUAL(success.get_bool(), true);
    }
}